

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ArrayReductionMethod::checkArguments
          (ArrayReductionMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *this_00;
  Diagnostic *this_01;
  SourceLocation SVar3;
  SourceLocation SVar4;
  not_null<const_slang::ast::Type_*> *pnVar5;
  SourceRange sourceRange;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  if (bVar2) {
    if (iterExpr == (Expression *)0x0) {
      this_00 = Type::getArrayElementType(((*args->_M_ptr)->type).ptr);
      bVar2 = Type::isIntegral(this_00);
      if (bVar2) {
        return this_00;
      }
      SVar4 = ((*args->_M_ptr)->sourceRange).startLoc;
      SVar3 = ((*args->_M_ptr)->sourceRange).endLoc;
    }
    else {
      bVar2 = Type::isIntegral((iterExpr->type).ptr);
      if (bVar2) {
        pnVar5 = &iterExpr->type;
        goto LAB_0032f27c;
      }
      SVar4 = (iterExpr->sourceRange).startLoc;
      SVar3 = (iterExpr->sourceRange).endLoc;
    }
    sourceRange.endLoc = SVar3;
    sourceRange.startLoc = SVar4;
    this_01 = ASTContext::addDiag(context,(DiagCode)0x2000b,sourceRange);
    Diagnostic::operator<<(this_01,&(this->super_SystemSubroutine).name);
  }
  pnVar5 = (not_null<const_slang::ast::Type_*> *)&pCVar1->errorType;
LAB_0032f27c:
  return pnVar5->ptr;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (iterExpr) {
            if (!iterExpr->type->isIntegral()) {
                context.addDiag(diag::ArrayMethodIntegral, iterExpr->sourceRange) << name;
                return comp.getErrorType();
            }

            return *iterExpr->type;
        }
        else {
            auto elemType = args[0]->type->getArrayElementType();
            SLANG_ASSERT(elemType);

            if (!elemType->isIntegral()) {
                context.addDiag(diag::ArrayMethodIntegral, args[0]->sourceRange) << name;
                return comp.getErrorType();
            }

            return *elemType;
        }
    }